

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::RemoveContextHook(ImGuiContext *ctx,ImGuiID hook_id)

{
  ImGuiContextHook *pIVar1;
  int in_ESI;
  long in_RDI;
  int n;
  ImGuiContext *g;
  int local_1c;
  
  for (local_1c = 0; local_1c < *(int *)(in_RDI + 0x53c0); local_1c = local_1c + 1) {
    pIVar1 = ImVector<ImGuiContextHook>::operator[]
                       ((ImVector<ImGuiContextHook> *)(in_RDI + 0x53c0),local_1c);
    if (*(int *)pIVar1 == in_ESI) {
      pIVar1 = ImVector<ImGuiContextHook>::operator[]
                         ((ImVector<ImGuiContextHook> *)(in_RDI + 0x53c0),local_1c);
      *(undefined4 *)(pIVar1 + 4) = 7;
    }
  }
  return;
}

Assistant:

void ImGui::RemoveContextHook(ImGuiContext* ctx, ImGuiID hook_id)
{
    ImGuiContext& g = *ctx;
    IM_ASSERT(hook_id != 0);
    for (int n = 0; n < g.Hooks.Size; n++)
        if (g.Hooks[n].HookId == hook_id)
            g.Hooks[n].Type = ImGuiContextHookType_PendingRemoval_;
}